

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void absl::base_internal::LowLevelAlloc::Free(void *v)

{
  Arena *arena;
  ArenaLock section;
  ArenaLock local_a0;
  
  if (v != (void *)0x0) {
    arena = *(Arena **)((long)v + -0x10);
    anon_unknown_0::ArenaLock::ArenaLock(&local_a0,arena);
    AddToFreelist(v,arena);
    if (arena->allocation_count < 1) {
      raw_log_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x204,"Check %s failed: %s",
                 "arena->allocation_count > 0","nothing in arena to free");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/base/internal/low_level_alloc.cc"
                    ,0x204,"static void absl::base_internal::LowLevelAlloc::Free(void *)");
    }
    arena->allocation_count = arena->allocation_count + -1;
    anon_unknown_0::ArenaLock::Leave(&local_a0);
    anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)(ulong)(uint)local_a0._0_4_);
  }
  return;
}

Assistant:

void LowLevelAlloc::Free(void *v) {
  if (v != nullptr) {
    AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                                 sizeof(f->header));
    LowLevelAlloc::Arena *arena = f->header.arena;
    ArenaLock section(arena);
    AddToFreelist(v, arena);
    ABSL_RAW_CHECK(arena->allocation_count > 0, "nothing in arena to free");
    arena->allocation_count--;
    section.Leave();
  }
}